

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_constant_pass.cpp
# Opt level: O0

Status __thiscall spvtools::opt::EliminateDeadConstantPass::Process(EliminateDeadConstantPass *this)

{
  Instruction *this_00;
  uint uVar1;
  size_t sVar2;
  bool bVar3;
  Op OVar4;
  uint32_t uVar5;
  Status SVar6;
  IRContext *pIVar7;
  reference ppIVar8;
  Operand *pOVar9;
  DefUseManager *pDVar10;
  size_type sVar11;
  mapped_type *pmVar12;
  MessageConsumer *consumer;
  reference ppIVar13;
  pair<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_bool> pVar14;
  Instruction *dc;
  iterator __end2_1;
  iterator __begin2_1;
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  *__range2_1;
  spv_position_t local_170;
  Instruction *local_158;
  Instruction *def_inst;
  uint32_t operand_id;
  uint32_t i;
  Instruction *local_140;
  Instruction *inst;
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  dead_consts;
  anon_class_8_1_a7c1402f local_f0;
  function<void_(spvtools::opt::Instruction_*,_unsigned_int)> local_e8;
  size_t local_c8;
  size_t count;
  Instruction *pIStack_b8;
  uint32_t const_id;
  Instruction *c;
  iterator __end2;
  iterator __begin2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> constants;
  unordered_map<spvtools::opt::Instruction_*,_unsigned_long,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>_>
  use_counts;
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  working_list;
  EliminateDeadConstantPass *this_local;
  
  std::
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  ::unordered_set((unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                   *)&use_counts._M_h._M_single_bucket);
  std::
  unordered_map<spvtools::opt::Instruction_*,_unsigned_long,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>_>
  ::unordered_map((unordered_map<spvtools::opt::Instruction_*,_unsigned_long,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>_>
                   *)&constants.
                      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pIVar7 = Pass::context(&this->super_Pass);
  IRContext::GetConstants
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &__range2,pIVar7);
  __end2 = std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           ::begin((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    *)&__range2);
  c = (Instruction *)
      std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::end
                ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  *)&__range2);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                     *)&c), bVar3) {
    ppIVar8 = __gnu_cxx::
              __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
              ::operator*(&__end2);
    pIStack_b8 = *ppIVar8;
    count._4_4_ = Instruction::result_id(pIStack_b8);
    local_c8 = 0;
    pIVar7 = Pass::context(&this->super_Pass);
    pDVar10 = IRContext::get_def_use_mgr(pIVar7);
    uVar5 = count._4_4_;
    local_f0.count = &local_c8;
    std::function<void(spvtools::opt::Instruction*,unsigned_int)>::
    function<spvtools::opt::EliminateDeadConstantPass::Process()::__0,void>
              ((function<void(spvtools::opt::Instruction*,unsigned_int)> *)&local_e8,&local_f0);
    analysis::DefUseManager::ForEachUse(pDVar10,uVar5,&local_e8);
    std::function<void_(spvtools::opt::Instruction_*,_unsigned_int)>::~function(&local_e8);
    sVar2 = local_c8;
    pmVar12 = std::
              unordered_map<spvtools::opt::Instruction_*,_unsigned_long,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>_>
              ::operator[]((unordered_map<spvtools::opt::Instruction_*,_unsigned_long,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>_>
                            *)&constants.
                               super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           &stack0xffffffffffffff48);
    *pmVar12 = sVar2;
    if (local_c8 == 0) {
      pVar14 = std::
               unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
               ::insert((unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                         *)&use_counts._M_h._M_single_bucket,&stack0xffffffffffffff48);
      dead_consts._M_h._M_single_bucket =
           (__node_base_ptr)
           pVar14.first.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
    }
    __gnu_cxx::
    __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
    ::operator++(&__end2);
  }
  std::
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  ::unordered_set((unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                   *)&inst);
  do {
    bVar3 = std::
            unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
            ::empty((unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                     *)&use_counts._M_h._M_single_bucket);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      __end2_1 = std::
                 unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                 ::begin((unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                          *)&inst);
      dc = (Instruction *)
           std::
           unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
           ::end((unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                  *)&inst);
      while (bVar3 = std::__detail::operator!=
                               (&__end2_1.
                                 super__Node_iterator_base<spvtools::opt::Instruction_*,_false>,
                                (_Node_iterator_base<spvtools::opt::Instruction_*,_false> *)&dc),
            bVar3) {
        ppIVar13 = std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>::
                   operator*(&__end2_1);
        this_00 = *ppIVar13;
        pIVar7 = Pass::context(&this->super_Pass);
        uVar5 = Instruction::result_id(this_00);
        IRContext::KillDef(pIVar7,uVar5);
        std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>::operator++
                  (&__end2_1);
      }
      bVar3 = std::
              unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
              ::empty((unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                       *)&inst);
      SVar6 = SuccessWithChange;
      if (bVar3) {
        SVar6 = SuccessWithoutChange;
      }
      std::
      unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
      ::~unordered_set((unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                        *)&inst);
      std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
      ~vector((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *
              )&__range2);
      std::
      unordered_map<spvtools::opt::Instruction_*,_unsigned_long,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>_>
      ::~unordered_map((unordered_map<spvtools::opt::Instruction_*,_unsigned_long,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>_>
                        *)&constants.
                           super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
      ::~unordered_set((unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                        *)&use_counts._M_h._M_single_bucket);
      return SVar6;
    }
    _operand_id = (__node_type *)
                  std::
                  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                  ::begin((unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                           *)&use_counts._M_h._M_single_bucket);
    ppIVar13 = std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>::operator*
                         ((_Node_iterator<spvtools::opt::Instruction_*,_true,_false> *)&operand_id);
    local_140 = *ppIVar13;
    OVar4 = Instruction::opcode(local_140);
    if ((OVar4 == OpConstantComposite) ||
       (OVar4 == OpSpecConstantComposite || OVar4 == OpSpecConstantOp)) {
      for (def_inst._4_4_ = 0; uVar1 = def_inst._4_4_, uVar5 = Instruction::NumInOperands(local_140)
          , uVar1 < uVar5; def_inst._4_4_ = def_inst._4_4_ + 1) {
        pOVar9 = Instruction::GetInOperand(local_140,def_inst._4_4_);
        if (pOVar9->type == SPV_OPERAND_TYPE_ID) {
          def_inst._0_4_ = Instruction::GetSingleWordInOperand(local_140,def_inst._4_4_);
          pIVar7 = Pass::context(&this->super_Pass);
          pDVar10 = IRContext::get_def_use_mgr(pIVar7);
          local_158 = analysis::DefUseManager::GetDef(pDVar10,(uint32_t)def_inst);
          sVar11 = std::
                   unordered_map<spvtools::opt::Instruction_*,_unsigned_long,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>_>
                   ::count((unordered_map<spvtools::opt::Instruction_*,_unsigned_long,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>_>
                            *)&constants.
                               super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_158);
          if (sVar11 != 0) {
            pmVar12 = std::
                      unordered_map<spvtools::opt::Instruction_*,_unsigned_long,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>_>
                      ::operator[]((unordered_map<spvtools::opt::Instruction_*,_unsigned_long,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>_>
                                    *)&constants.
                                       super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_158
                                  );
            if (*pmVar12 == 0) {
              consumer = Pass::consumer(&this->super_Pass);
              local_170.line = 0x50;
              local_170.column = 0;
              local_170.index = 0;
              Log(consumer,SPV_MSG_INTERNAL_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/eliminate_dead_constant_pass.cpp"
                  ,&local_170,"assertion failed: use_counts[def_inst] > 0");
              exit(1);
            }
            pmVar12 = std::
                      unordered_map<spvtools::opt::Instruction_*,_unsigned_long,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>_>
                      ::operator[]((unordered_map<spvtools::opt::Instruction_*,_unsigned_long,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>_>
                                    *)&constants.
                                       super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_158
                                  );
            *pmVar12 = *pmVar12 - 1;
            pmVar12 = std::
                      unordered_map<spvtools::opt::Instruction_*,_unsigned_long,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>_>
                      ::operator[]((unordered_map<spvtools::opt::Instruction_*,_unsigned_long,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>_>
                                    *)&constants.
                                       super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_158
                                  );
            if (*pmVar12 == 0) {
              std::
              unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
              ::insert((unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                        *)&use_counts._M_h._M_single_bucket,&local_158);
            }
          }
        }
      }
    }
    std::
    unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
    ::insert((unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
              *)&inst,&local_140);
    std::
    unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
    ::erase((unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
             *)&use_counts._M_h._M_single_bucket,&local_140);
  } while( true );
}

Assistant:

Pass::Status EliminateDeadConstantPass::Process() {
  std::unordered_set<Instruction*> working_list;
  // Traverse all the instructions to get the initial set of dead constants as
  // working list and count number of real uses for constants. Uses in
  // annotation instructions do not count.
  std::unordered_map<Instruction*, size_t> use_counts;
  std::vector<Instruction*> constants = context()->GetConstants();
  for (auto* c : constants) {
    uint32_t const_id = c->result_id();
    size_t count = 0;
    context()->get_def_use_mgr()->ForEachUse(
        const_id, [&count](Instruction* user, uint32_t index) {
          (void)index;
          spv::Op op = user->opcode();
          if (!(IsAnnotationInst(op) || IsDebug1Inst(op) || IsDebug2Inst(op) ||
                IsDebug3Inst(op))) {
            ++count;
          }
        });
    use_counts[c] = count;
    if (!count) {
      working_list.insert(c);
    }
  }

  // Start from the constants with 0 uses, back trace through the def-use chain
  // to find all dead constants.
  std::unordered_set<Instruction*> dead_consts;
  while (!working_list.empty()) {
    Instruction* inst = *working_list.begin();
    // Back propagate if the instruction contains IDs in its operands.
    switch (inst->opcode()) {
      case spv::Op::OpConstantComposite:
      case spv::Op::OpSpecConstantComposite:
      case spv::Op::OpSpecConstantOp:
        for (uint32_t i = 0; i < inst->NumInOperands(); i++) {
          // SpecConstantOp instruction contains 'opcode' as its operand. Need
          // to exclude such operands when decreasing uses.
          if (inst->GetInOperand(i).type != SPV_OPERAND_TYPE_ID) {
            continue;
          }
          uint32_t operand_id = inst->GetSingleWordInOperand(i);
          Instruction* def_inst =
              context()->get_def_use_mgr()->GetDef(operand_id);
          // If the use_count does not have any count for the def_inst,
          // def_inst must not be a constant, and should be ignored here.
          if (!use_counts.count(def_inst)) {
            continue;
          }
          // The number of uses should never be less then 0, so it can not be
          // less than 1 before it decreases.
          SPIRV_ASSERT(consumer(), use_counts[def_inst] > 0);
          --use_counts[def_inst];
          if (!use_counts[def_inst]) {
            working_list.insert(def_inst);
          }
        }
        break;
      default:
        break;
    }
    dead_consts.insert(inst);
    working_list.erase(inst);
  }

  // Turn all dead instructions and uses of them to nop
  for (auto* dc : dead_consts) {
    context()->KillDef(dc->result_id());
  }
  return dead_consts.empty() ? Status::SuccessWithoutChange
                             : Status::SuccessWithChange;
}